

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCataloger.cpp
# Opt level: O3

Action __thiscall
psy::C::NameCataloger::visitCompoundStatement(NameCataloger *this,CompoundStatementSyntax *node)

{
  StatementListSyntax *pSVar1;
  
  NameCatalog::indexNodeAndMarkAsEncloser
            ((this->catalog_)._M_t.
             super___uniq_ptr_impl<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>.
             _M_t.
             super__Tuple_impl<0UL,_psy::C::NameCatalog_*,_std::default_delete<psy::C::NameCatalog>_>
             .super__Head_base<0UL,_psy::C::NameCatalog_*,_false>._M_head_impl,(SyntaxNode *)node);
  for (pSVar1 = node->stmts_; pSVar1 != (StatementListSyntax *)0x0;
      pSVar1 = (pSVar1->
               super_CoreSyntaxNodeList<psy::C::StatementSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::StatementSyntax_*>_>
               ).
               super_List<psy::C::StatementSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::StatementSyntax_*>_>
               .next) {
    SyntaxVisitor::visit
              (&this->super_SyntaxVisitor,
               &((pSVar1->
                 super_CoreSyntaxNodeList<psy::C::StatementSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::StatementSyntax_*>_>
                 ).
                 super_List<psy::C::StatementSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::StatementSyntax_*>_>
                .value)->super_SyntaxNode);
  }
  NameCatalog::dropEncloser
            ((this->catalog_)._M_t.
             super___uniq_ptr_impl<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>.
             _M_t.
             super__Tuple_impl<0UL,_psy::C::NameCatalog_*,_std::default_delete<psy::C::NameCatalog>_>
             .super__Head_base<0UL,_psy::C::NameCatalog_*,_false>._M_head_impl);
  return Skip;
}

Assistant:

SyntaxVisitor::Action NameCataloger::visitCompoundStatement(const CompoundStatementSyntax* node)
{
    catalog_->indexNodeAndMarkAsEncloser(node);
    for (auto iter = node->statements(); iter; iter = iter->next)
        visit(iter->value);
    catalog_->dropEncloser();

    return Action::Skip;
}